

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_L_mult_inplace(m256v *LU,m256v *X_inout)

{
  undefined8 in_RSI;
  int *in_RDI;
  int j_1;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int iVar1;
  int local_18;
  int local_14;
  
  iVar1 = *in_RDI;
  while (local_14 = iVar1 + -1, -1 < local_14) {
    if (local_14 < in_RDI[1]) {
      in_stack_ffffffffffffffe4 = iVar1 + -2;
      while (iVar1 = local_14, -1 < in_stack_ffffffffffffffe4) {
        in_stack_ffffffffffffffc8 = in_RSI;
        iVar1 = in_stack_ffffffffffffffe4;
        m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd0),
                     (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
        m256v_multadd_row((m256v *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                          (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                          (uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x18),
                          (m256v *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd0),
                          (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffe4;
        in_stack_ffffffffffffffe4 = iVar1 + -1;
      }
    }
    else {
      m256v_clear_row((m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      local_18 = in_RDI[1];
      while (local_18 = local_18 + -1, iVar1 = local_14, -1 < local_18) {
        in_stack_ffffffffffffffd8 = in_RSI;
        in_stack_ffffffffffffffe0 = local_18;
        m256v_get_el((m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8)
        ;
        m256v_multadd_row((m256v *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                          (uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x18),
                          (m256v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_L_mult_inplace)(const MV_GEN_TYPE* LU, MV_GEN_TYPE* X_inout)
{
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			MV_GEN_N(_clear_row)(X_inout /* Y */, i);
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		}
	}
}